

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O1

void __thiscall dg::llvmdg::SDGBuilder::buildFuns(SDGBuilder *this)

{
  Module *pMVar1;
  Module *pMVar2;
  char cVar3;
  DependenceGraph *dg;
  Module *F;
  
  pMVar1 = this->_module;
  for (pMVar2 = *(Module **)(pMVar1 + 0x20); pMVar2 != pMVar1 + 0x18;
      pMVar2 = *(Module **)(pMVar2 + 8)) {
    F = pMVar2 + -0x38;
    if (pMVar2 == (Module *)0x0) {
      F = (Module *)0x0;
    }
    cVar3 = llvm::GlobalValue::isDeclaration();
    if (cVar3 == '\0') {
      dg = getOrCreateDG(this,(Function *)F);
      buildDG(this,dg,(Function *)F);
    }
  }
  return;
}

Assistant:

void buildFuns() {
        DBG_SECTION_BEGIN(sdg, "Building functions");
        // build dependence graph for each procedure
        for (auto &F : *_module) {
            if (F.isDeclaration()) {
                continue;
            }

            auto &g = getOrCreateDG(&F);
            buildDG(g, F);
        }
        DBG_SECTION_END(sdg, "Done building functions");
    }